

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O3

Leaf * __thiscall
SuffixTree::GeneralizedSuffixTree::AllocLeaf
          (GeneralizedSuffixTree *this,Node *parent,uint string_number)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  
  if ((ulong)string_number <
      (ulong)((long)(this->strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    pcVar2 = this->leaves;
    uVar1 = this->leaves_num;
    this->leaves_num = uVar1 + 1;
    lVar3 = (ulong)uVar1 * 0x10;
    *(Node **)(pcVar2 + lVar3) = parent;
    *(uint *)(pcVar2 + lVar3 + 8) = string_number;
    return (Leaf *)(pcVar2 + lVar3);
  }
  __assert_fail("string_number < strings.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                ,0xd6,"Leaf *SuffixTree::GeneralizedSuffixTree::AllocLeaf(Node *, uint)");
}

Assistant:

Leaf *GeneralizedSuffixTree::AllocLeaf (Node *parent, uint string_number)
{
    assert (string_number < strings.size());
	return new (leaves + (leaves_num++) * sizeof (Leaf)) Leaf (parent, string_number);
}